

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.c
# Opt level: O3

int mixed_queue_add(mixed_segment *new,mixed_segment *segment)

{
  vector *vector;
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  mixed_segment_info info;
  mixed_segment_info mStack_448;
  
  vector = (vector *)segment->data;
  memset(&mStack_448,0,0x420);
  iVar2 = mixed_segment_start(new);
  iVar3 = 0;
  if (iVar2 != 0) {
    iVar2 = vector_add(new,vector);
    iVar3 = 0;
    if (iVar2 != 0) {
      mixed_segment_info(&mStack_448,new);
      if (vector[2].count < mStack_448.max_inputs) {
        mStack_448.max_inputs = vector[2].count;
      }
      if (mStack_448.max_inputs != 0) {
        uVar4 = 0;
        do {
          mixed_segment_set_in(0,(uint32_t)uVar4,vector[2].data[uVar4],new);
          uVar4 = uVar4 + 1;
        } while (mStack_448.max_inputs != uVar4);
      }
      uVar1 = mStack_448.outputs;
      if (vector[1].count < mStack_448.outputs) {
        uVar1 = vector[1].count;
      }
      iVar3 = 1;
      if (uVar1 != 0) {
        uVar4 = 0;
        do {
          mixed_segment_set_out(0,(uint32_t)uVar4,vector[1].data[uVar4],new);
          uVar4 = uVar4 + 1;
        } while (uVar1 != uVar4);
      }
    }
  }
  return iVar3;
}

Assistant:

MIXED_EXPORT int mixed_queue_add(struct mixed_segment *new, struct mixed_segment *segment){
  struct queue_segment_data *data = (struct queue_segment_data *)segment->data;
  struct mixed_segment_info info = {0};

  if(!mixed_segment_start(new))
    return 0;
  
  if(!vector_add(new, (struct vector *)data))
    return 0;
  
  mixed_segment_info(&info, new);
  uint32_t ins = MIN(data->in_count, info.max_inputs);
  for(uint32_t i=0; i<ins; ++i){
    mixed_segment_set_in(MIXED_BUFFER, i, data->in[i], new);
  }
  uint32_t outs = MIN(data->out_count, info.outputs);
  for(uint32_t i=0; i<outs; ++i){
    mixed_segment_set_out(MIXED_BUFFER, i, data->out[i], new);
  }
  return 1;
}